

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O1

bool llvm::sys::commandLineFitsWithinSystemLimits(StringRef Program,ArrayRef<const_char_*> Args)

{
  bool bVar1;
  ulong MinCapacity;
  SmallVectorBase *this;
  long lVar2;
  ArrayRef<llvm::StringRef> Args_00;
  StringRef Program_00;
  char *A;
  SmallVector<llvm::StringRef,_8U> StringRefArgs;
  char *local_c8;
  SmallVectorBase local_c0;
  undefined1 local_b0 [128];
  
  Program_00.Length = Program.Length;
  this = (SmallVectorBase *)Program.Data;
  MinCapacity = Args.Length;
  local_c0.Size = 0;
  local_c0.Capacity = 8;
  local_c0.BeginX = local_b0;
  if (8 < MinCapacity) {
    this = &local_c0;
    SmallVectorBase::grow_pod(this,local_b0,MinCapacity,0x10);
  }
  if (MinCapacity != 0) {
    lVar2 = 0;
    do {
      local_c8 = *(char **)((long)Args.Data + lVar2);
      this = &local_c0;
      SmallVectorImpl<llvm::StringRef>::emplace_back<char_const*&>
                ((SmallVectorImpl<llvm::StringRef> *)&local_c0,&local_c8);
      lVar2 = lVar2 + 8;
    } while (MinCapacity << 3 != lVar2);
  }
  Args_00.Length._0_4_ = local_c0.Size;
  Args_00.Data = (StringRef *)local_c0.BeginX;
  Args_00.Length._4_4_ = 0;
  Program_00.Data = (char *)this;
  bVar1 = commandLineFitsWithinSystemLimits(Program_00,Args_00);
  if ((undefined1 *)local_c0.BeginX != local_b0) {
    free(local_c0.BeginX);
  }
  return bVar1;
}

Assistant:

bool sys::commandLineFitsWithinSystemLimits(StringRef Program,
                                            ArrayRef<const char *> Args) {
  SmallVector<StringRef, 8> StringRefArgs;
  StringRefArgs.reserve(Args.size());
  for (const char *A : Args)
    StringRefArgs.emplace_back(A);
  return commandLineFitsWithinSystemLimits(Program, StringRefArgs);
}